

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

void free_cache(cache *Cache)

{
  long lVar1;
  ulong uVar2;
  
  if (Cache->is_init == true) {
    Cache->is_init = false;
    if (Cache->max_length != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        if ((&Cache->records->valid)[lVar1] == true) {
          (*Cache->realse)((record *)((long)&Cache->records->data + lVar1));
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x18;
      } while (uVar2 < Cache->max_length);
    }
    free(Cache->records);
    free(Cache->stack);
    free_hashtable(&Cache->label_hash);
    return;
  }
  return;
}

Assistant:

void free_cache(cache*Cache){
  if(Cache->is_init==true){
    Cache->is_init = false;
    for(int i=0;i<Cache->max_length;i++){
      if(Cache->records[i].valid){
        // printf("1\n");
        Cache->realse(&Cache->records[i]);
      }
    }
    free(Cache->records);
    free(Cache->stack);
    free_hashtable(&Cache->label_hash);
  }
}